

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O1

cf_bool_t cf_lite_queue_push_back(cf_lite_queue_t *self,void *data)

{
  cf_size_t dst_size;
  cf_bool_t cVar1;
  
  cVar1 = 0;
  if (data != (void *)0x0) {
    if ((self->count == self->capacity) && (cVar1 = cf_lite_queue_extend(self), cVar1 == 0)) {
      return 0;
    }
    if (self->count == 0) {
      self->head = 0;
      self->tail = 0;
    }
    else {
      self->tail = (cf_uint_t)((ulong)(self->tail + 1) % self->capacity);
    }
    dst_size = self->elm_size;
    cf_memcpy_s((cf_void_t *)(self->tail * dst_size + (long)self->items),dst_size,data,dst_size);
    self->count = self->count + 1;
    cVar1 = 1;
  }
  return cVar1;
}

Assistant:

cf_bool_t cf_lite_queue_push_back(cf_lite_queue_t* self, void* data) {
    if (!data) {
        return CF_FALSE;
    }

    if (self->count == self->capacity) {
        if (!cf_lite_queue_extend(self)) {
            return CF_FALSE;
        }
    }

    if (self->count == 0) {
        self->head = 0;
        self->tail = 0;
    } else {
        self->tail = (self->tail + 1) % self->capacity;
    }
    cf_memcpy_s((void*)&((((cf_uint8_t*)(self->items))[self->elm_size * self->tail])), \
        self->elm_size, data, self->elm_size);
    self->count++;
    return CF_TRUE;
}